

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m128i xy_y_convolve_2tap_2x2_half_pel_sse2(int16_t *src,__m128i *s_32)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  longlong extraout_RDX;
  undefined1 (*in_RSI) [16];
  long in_RDI;
  __m128i alVar4;
  __m128i s_128 [2];
  ulong local_a8;
  ulong local_88;
  
  uVar3 = loadu_int32((void *)(in_RDI + 4));
  local_88 = (ulong)uVar3;
  *(ulong *)in_RSI[1] = local_88;
  *(undefined8 *)(in_RSI[1] + 8) = 0;
  auVar1 = vpunpckldq_avx(*in_RSI,in_RSI[1]);
  uVar3 = loadu_int32((void *)(in_RDI + 8));
  local_a8 = (ulong)uVar3;
  *(ulong *)*in_RSI = local_a8;
  *(undefined8 *)(*in_RSI + 8) = 0;
  auVar2 = vpunpckldq_avx(in_RSI[1],*in_RSI);
  vpaddw_avx(auVar1,auVar2);
  alVar4[1] = extraout_RDX;
  alVar4[0] = (longlong)in_RSI;
  return alVar4;
}

Assistant:

static inline __m128i xy_y_convolve_2tap_2x2_half_pel_sse2(
    const int16_t *const src, __m128i s_32[2]) {
  __m128i s_128[2];

  s_32[1] = _mm_cvtsi32_si128(loadu_int32(src + 2));
  s_128[0] = _mm_unpacklo_epi32(s_32[0], s_32[1]);
  s_32[0] = _mm_cvtsi32_si128(loadu_int32(src + 2 * 2));
  s_128[1] = _mm_unpacklo_epi32(s_32[1], s_32[0]);
  return _mm_add_epi16(s_128[0], s_128[1]);
}